

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

String * __thiscall
kj::str<float,char_const(&)[6],double,char_const(&)[6],int>
          (String *__return_storage_ptr__,kj *this,float *params,char (*params_1) [6],
          double *params_2,char (*params_3) [6],int *params_4)

{
  CappedArray<char,_14UL> *in_stack_ffffffffffffff48;
  ArrayPtr<const_char> local_b0;
  ArrayPtr<const_char> local_a0;
  CappedArray<char,_24UL> local_90;
  CappedArray<char,_14UL> local_70;
  CappedArray<char,_32UL> local_58;
  
  toCharSequence<float>(&local_90,(float *)this);
  local_a0 = toCharSequence<char_const(&)[6]>((char (*) [6])params);
  toCharSequence<double>(&local_58,(double *)params_1);
  local_b0 = toCharSequence<char_const(&)[6]>((char (*) [6])params_2);
  toCharSequence<int>(&local_70,(int *)params_3);
  _::
  concat<kj::CappedArray<char,24ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,32ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>>
            (__return_storage_ptr__,(_ *)&local_90,(CappedArray<char,_24UL> *)&local_a0,
             (ArrayPtr<const_char> *)&local_58,(CappedArray<char,_32UL> *)&local_b0,
             (ArrayPtr<const_char> *)&local_70,in_stack_ffffffffffffff48);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}